

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O2

longdouble *
trng::math::detail::inv_GammaP<long_double>
          (longdouble *__return_storage_ptr__,longdouble a,longdouble p)

{
  longdouble *plVar1;
  int iVar2;
  detail *in_RSI;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble lVar6;
  longdouble lVar7;
  longdouble in_ST4;
  
  lVar7 = in_ST4;
  lgammal();
  logl();
  lVar4 = lVar7;
  expl();
  if (a <= (longdouble)1) {
    lVar5 = lVar7;
    lVar6 = lVar7;
    if ((longdouble)1 - (a * (longdouble)0.12 + (longdouble)0.253) * a <= p) {
      plVar1 = (longdouble *)log1pl();
      in_ST3 = (longdouble)1 - in_ST3;
      lVar4 = lVar7;
    }
    else {
      plVar1 = (longdouble *)powl();
      lVar4 = lVar7;
    }
  }
  else {
    in_ST4 = lVar4;
    logl();
    sqrtl();
    lVar5 = lVar4;
    sqrtl();
    lVar6 = lVar5;
    plVar1 = (longdouble *)powl();
    in_ST3 = lVar7 * a;
    if (lVar7 * a <= _DAT_00261720) {
      in_ST3 = _DAT_00261720;
    }
  }
  iVar2 = 0x41;
  while( true ) {
    iVar2 = iVar2 + -1;
    if (iVar2 == 0) {
      return plVar1;
    }
    if (in_ST3 <= (longdouble)0) break;
    GammaP<long_double,true>(__return_storage_ptr__,in_RSI,a,in_ST3);
    if (a <= (longdouble)1) {
      logl();
      plVar1 = (longdouble *)expl();
    }
    else {
      logl();
      plVar1 = (longdouble *)expl();
      lVar4 = in_ST2 * lVar4;
    }
    lVar4 = (in_ST4 - p) / lVar4;
    lVar3 = (-(longdouble)1 + (-(longdouble)1 + a) / in_ST3) * lVar4;
    lVar7 = (longdouble)1;
    if (lVar7 <= lVar3) {
      lVar3 = lVar7;
    }
    lVar7 = lVar4 / (lVar7 - lVar3 * (longdouble)0.5);
    lVar4 = in_ST3 - lVar7;
    in_ST3 = (lVar7 + lVar4) * (longdouble)0.5;
    if ((longdouble)0 < lVar4) {
      in_ST3 = lVar4;
    }
    in_ST4 = lVar5;
    lVar4 = lVar6;
    lVar5 = lVar6;
    if (ABS(lVar7) < SQRT((longdouble)1.0842022e-19) * in_ST3) {
      return plVar1;
    }
  }
  return plVar1;
}

Assistant:

TRNG_CUDA_ENABLE T inv_GammaP(T a, T p) {
        const T eps{sqrt(numeric_limits<T>::epsilon())};
        const T a1{a - 1};
        const T glna{ln_Gamma(a)};
        const T lna1{ln(a1)};
        const T afac{exp(a1 * (lna1 - 1) - glna)};
        T x;
        // initial guess
        if (a > T{1}) {
          const T pp{p < T{1} / T{2} ? p : 1 - p};
          const T t{sqrt(-2 * ln(pp))};
          x = (T{2.30753} + t * T{0.27061}) / (1 + t * (T{0.99229} + t * T{0.04481})) - t;
          x = p < T{1} / T{2} ? -x : x;
          x = utility::max(T{1} / T{1000}, a * pow(1 - 1 / (9 * a) - x / (3 * sqrt(a)), T{3}));
        } else {
          const T t{1 - a * (T{0.253} + a * T{0.12})};
          x = p < t ? pow(p / t, 1 / a) : 1 - ln1p(-(p - t) / (1 - t));
        }
        // refinement by Halley's method
        for (int i{0}; i < numeric_limits<T>::digits; ++i) {
          if (x <= 0) {
            x = 0;
            break;
          }
          const T err{GammaP<T, true>(a, x) - p};
          T t;
          if (a > 1)
            t = afac * exp(-(x - a1) + a1 * (ln(x) - lna1));
          else
            t = exp(-x + a1 * ln(x) - glna);
          const T u{err / t};
          t = u / (1 - utility::min(T{1}, u * ((a - 1) / x - 1)) / 2);
          x -= t;
          x = x <= 0 ? (x + t) / 2 : x;
          if (abs(t) < eps * x)
            break;
        }
        return x;
      }